

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-font.c
# Opt level: O0

void plutovg_text_iterator_init
               (plutovg_text_iterator_t *it,void *text,int length,plutovg_text_encoding_t encoding)

{
  int local_1c;
  plutovg_text_encoding_t encoding_local;
  int length_local;
  void *text_local;
  plutovg_text_iterator_t *it_local;
  
  local_1c = length;
  if (length == -1) {
    local_1c = plutovg_text_iterator_length(text,encoding);
  }
  it->text = text;
  it->length = local_1c;
  it->encoding = encoding;
  it->index = 0;
  return;
}

Assistant:

void plutovg_text_iterator_init(plutovg_text_iterator_t* it, const void* text, int length, plutovg_text_encoding_t encoding)
{
    if(length == -1)
        length = plutovg_text_iterator_length(text, encoding);
    it->text = text;
    it->length = length;
    it->encoding = encoding;
    it->index = 0;
}